

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O1

int If_ManImproveCutCost(If_Man_t *p,Vec_Ptr_t *vFront)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)vFront->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(*(int *)((long)vFront->pArray[lVar2] + 0xc) == 0);
      lVar2 = lVar2 + 1;
    } while (vFront->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int If_ManImproveCutCost( If_Man_t * p, Vec_Ptr_t * vFront )
{
    If_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        if ( pFanin->nRefs == 0 )
            Counter++;
    return Counter;
}